

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O3

int pcap_findalldevs(pcap_if_t **alldevsp,char *errbuf)

{
  int iVar1;
  _func_int_pcap_if_t_ptr_ptr_char_ptr *p_Var2;
  int iVar3;
  char *pcVar4;
  
  iVar1 = pcap_platform_finddevs(alldevsp,errbuf);
  iVar3 = -1;
  if (iVar1 != -1) {
    if (capture_source_types[0].findalldevs_op != (_func_int_pcap_if_t_ptr_ptr_char_ptr *)0x0) {
      pcVar4 = pcap_statustostr::ebuf;
      p_Var2 = capture_source_types[0].findalldevs_op;
      do {
        iVar1 = (*p_Var2)(alldevsp,errbuf);
        if (iVar1 == -1) {
          if (*alldevsp == (pcap_if_t *)0x0) {
            return -1;
          }
          pcap_freealldevs(*alldevsp);
          *alldevsp = (pcap_if_t *)0x0;
          return -1;
        }
        p_Var2 = *(_func_int_pcap_if_t_ptr_ptr_char_ptr **)pcVar4;
        pcVar4 = (char *)((long)pcVar4 + 0x10);
      } while (p_Var2 != (_func_int_pcap_if_t_ptr_ptr_char_ptr *)0x0);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
pcap_findalldevs(pcap_if_t **alldevsp, char *errbuf)
{
	size_t i;

	/*
	 * Find all the local network interfaces on which we
	 * can capture.
	 */
	if (pcap_platform_finddevs(alldevsp, errbuf) == -1)
		return (-1);

	/*
	 * Ask each of the non-local-network-interface capture
	 * source types what interfaces they have.
	 */
	for (i = 0; capture_source_types[i].findalldevs_op != NULL; i++) {
		if (capture_source_types[i].findalldevs_op(alldevsp, errbuf) == -1) {
			/*
			 * We had an error; free the list we've been
			 * constructing.
			 */
			if (*alldevsp != NULL) {
				pcap_freealldevs(*alldevsp);
				*alldevsp = NULL;
			}
			return (-1);
		}
	}

	return (0);
}